

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O0

void duckdb::SubstringFunction<duckdb::SubstringUnicodeOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  reference b;
  reference a;
  idx_t iVar1;
  anon_class_8_1_6971b95b fun;
  Vector *in_RDX;
  DataChunk *in_RDI;
  value_type *length_vector;
  value_type *offset_vector;
  value_type *input_vector;
  idx_t in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  Vector *in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  Vector *in_stack_ffffffffffffffa8;
  anon_class_8_1_6971b95b in_stack_ffffffffffffffb0;
  
  b = vector<duckdb::Vector,_true>::operator[]
                ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                );
  a = vector<duckdb::Vector,_true>::operator[]
                ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                );
  iVar1 = DataChunk::ColumnCount((DataChunk *)0x137fa54);
  if (iVar1 == 3) {
    fun.result = vector<duckdb::Vector,_true>::operator[]
                           (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    DataChunk::size(in_RDI);
    TernaryExecutor::
    Execute<duckdb::string_t,long,long,duckdb::string_t,duckdb::SubstringFunction<duckdb::SubstringUnicodeOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,long,long)_1_>
              (a,b,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,fun
              );
  }
  else {
    DataChunk::size(in_RDI);
    BinaryExecutor::
    Execute<duckdb::string_t,long,duckdb::string_t,duckdb::SubstringFunction<duckdb::SubstringUnicodeOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,long)_1_>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RDX,(idx_t)a,
               in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

static void SubstringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input_vector = args.data[0];
	auto &offset_vector = args.data[1];
	if (args.ColumnCount() == 3) {
		auto &length_vector = args.data[2];

		TernaryExecutor::Execute<string_t, int64_t, int64_t, string_t>(
		    input_vector, offset_vector, length_vector, result, args.size(),
		    [&](string_t input_string, int64_t offset, int64_t length) {
			    return OP::Substring(result, input_string, offset, length);
		    });
	} else {
		BinaryExecutor::Execute<string_t, int64_t, string_t>(
		    input_vector, offset_vector, result, args.size(), [&](string_t input_string, int64_t offset) {
			    return OP::Substring(result, input_string, offset, NumericLimits<uint32_t>::Maximum());
		    });
	}
}